

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

ssize_t __thiscall
wasm::StackIRToBinaryWriter::write(StackIRToBinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  BinaryInstWriter *this_00;
  Index i;
  pointer ppSVar1;
  StackInst *pSVar2;
  Try *curr;
  uint *puVar3;
  reference pvVar4;
  reference extraout_RAX;
  char *__function;
  pointer ppSVar5;
  undefined1 local_68 [8];
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  
  if ((this->func->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    WasmBinaryWriter::writeDebugLocation(this->parent,(DebugLocation *)&this->func->prologLocation);
  }
  this_00 = &this->writer;
  BinaryInstWriter::mapLocalsAndEmitHeader(this_00);
  local_68 = (undefined1  [8])0x0;
  catchIndexStack.fixed._M_elems[2] = 0;
  catchIndexStack.fixed._M_elems[3] = 0;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppSVar5 = (this->stackIR->
            super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (this->stackIR->
            super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppSVar5 == ppSVar1) {
      if ((this->func->epilogLocation).
          super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == false) {
        WasmBinaryWriter::writeNoDebugLocation(this->parent);
      }
      else {
        WasmBinaryWriter::writeDebugLocation
                  (this->parent,(DebugLocation *)&this->func->epilogLocation);
      }
      catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0xb;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
               emplace_back<unsigned_char>
                         (&((this->writer).o)->
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (uchar *)((long)&catchIndexStack.flexible.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (catchIndexStack.fixed._M_elems._8_8_ != 0) {
        operator_delete((void *)catchIndexStack.fixed._M_elems._8_8_,
                        (long)catchIndexStack.flexible.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        catchIndexStack.fixed._M_elems._8_8_);
        pvVar4 = extraout_RAX;
      }
      return (ssize_t)pvVar4;
    }
    pSVar2 = *ppSVar5;
    if (pSVar2 != (StackInst *)0x0) {
      switch(pSVar2->op) {
      case IfElse:
        if ((((If *)pSVar2->origin)->super_SpecificExpression<(wasm::Expression::Id)2>).
            super_Expression._id != IfId) {
          __function = "T *wasm::Expression::cast() [T = wasm::If]";
          goto LAB_00c9e907;
        }
        BinaryInstWriter::emitIfElse(this_00,(If *)pSVar2->origin);
        break;
      case TryBegin:
        catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        SmallVector<unsigned_int,_4UL>::push_back
                  ((SmallVector<unsigned_int,_4UL> *)local_68,
                   (uint *)((long)&catchIndexStack.flexible.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      case Basic:
      case BlockBegin:
      case IfBegin:
      case LoopBegin:
      case TryTableBegin:
        if (this->sourceMap == true) {
          WasmBinaryWriter::writeDebugLocation(this->parent,pSVar2->origin,this->func);
        }
        BinaryInstWriter::visit(this_00,pSVar2->origin);
        if (this->sourceMap == true) {
          WasmBinaryWriter::writeDebugLocationEnd(this->parent,pSVar2->origin,this->func);
        }
        break;
      case Catch:
        curr = (Try *)pSVar2->origin;
        if ((curr->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id != TryId
           ) {
LAB_00c9e8c3:
          __function = "T *wasm::Expression::cast() [T = wasm::Try]";
LAB_00c9e907:
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,__function);
        }
        puVar3 = SmallVector<unsigned_int,_4UL>::back((SmallVector<unsigned_int,_4UL> *)local_68);
        i = *puVar3;
        *puVar3 = i + 1;
        BinaryInstWriter::emitCatch(this_00,curr,i);
        break;
      case CatchAll:
        if ((((Try *)pSVar2->origin)->super_SpecificExpression<(wasm::Expression::Id)52>).
            super_Expression._id != TryId) goto LAB_00c9e8c3;
        BinaryInstWriter::emitCatchAll(this_00,(Try *)pSVar2->origin);
        break;
      case Delegate:
        if ((((Try *)pSVar2->origin)->super_SpecificExpression<(wasm::Expression::Id)52>).
            super_Expression._id != TryId) goto LAB_00c9e8c3;
        BinaryInstWriter::emitDelegate(this_00,(Try *)pSVar2->origin);
        if ((pointer)catchIndexStack.fixed._M_elems._8_8_ ==
            catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (local_68 == (undefined1  [8])0x0) goto LAB_00c9e911;
          local_68 = (undefined1  [8])((long)local_68 - 1);
        }
        else {
          catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start =
               catchIndexStack.flexible.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
        }
        break;
      case TryEnd:
        if ((pointer)catchIndexStack.fixed._M_elems._8_8_ ==
            catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (local_68 == (undefined1  [8])0x0) {
LAB_00c9e911:
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x75,
                          "void wasm::SmallVector<unsigned int, 4>::pop_back() [T = unsigned int, N = 4]"
                         );
          }
          local_68 = (undefined1  [8])((long)local_68 - 1);
        }
        else {
          catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start =
               catchIndexStack.flexible.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
        }
      case BlockEnd:
      case IfEnd:
      case LoopEnd:
      case TryTableEnd:
        BinaryInstWriter::emitScopeEnd(this_00,pSVar2->origin);
        break;
      default:
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0xcb5);
      }
    }
    ppSVar5 = ppSVar5 + 1;
  } while( true );
}

Assistant:

void StackIRToBinaryWriter::write() {
  if (func->prologLocation) {
    parent.writeDebugLocation(*func->prologLocation);
  }
  writer.mapLocalsAndEmitHeader();
  // Stack to track indices of catches within a try
  SmallVector<Index, 4> catchIndexStack;
  for (auto* inst : stackIR) {
    if (!inst) {
      continue; // a nullptr is just something we can skip
    }
    switch (inst->op) {
      case StackInst::TryBegin:
        catchIndexStack.push_back(0);
        [[fallthrough]];
      case StackInst::Basic:
      case StackInst::BlockBegin:
      case StackInst::IfBegin:
      case StackInst::LoopBegin:
      case StackInst::TryTableBegin: {
        if (sourceMap) {
          parent.writeDebugLocation(inst->origin, func);
        }
        writer.visit(inst->origin);
        if (sourceMap) {
          parent.writeDebugLocationEnd(inst->origin, func);
        }
        break;
      }
      case StackInst::TryEnd:
        catchIndexStack.pop_back();
        [[fallthrough]];
      case StackInst::BlockEnd:
      case StackInst::IfEnd:
      case StackInst::LoopEnd:
      case StackInst::TryTableEnd: {
        writer.emitScopeEnd(inst->origin);
        break;
      }
      case StackInst::IfElse: {
        writer.emitIfElse(inst->origin->cast<If>());
        break;
      }
      case StackInst::Catch: {
        writer.emitCatch(inst->origin->cast<Try>(), catchIndexStack.back()++);
        break;
      }
      case StackInst::CatchAll: {
        writer.emitCatchAll(inst->origin->cast<Try>());
        break;
      }
      case StackInst::Delegate: {
        writer.emitDelegate(inst->origin->cast<Try>());
        // Delegates end the try, like a TryEnd.
        catchIndexStack.pop_back();
        break;
      }
      default:
        WASM_UNREACHABLE("unexpected op");
    }
  }
  // Indicate the debug location corresponding to the end opcode that
  // terminates the function code.
  if (func->epilogLocation) {
    parent.writeDebugLocation(*func->epilogLocation);
  } else {
    // The end opcode has no debug location.
    parent.writeNoDebugLocation();
  }
  writer.emitFunctionEnd();
}